

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.cpp
# Opt level: O0

void chai_puppet(ChaiScript *chai,NameMap *namemap,string *script_prefix)

{
  string *in_RDX;
  undefined8 in_RSI;
  ChaiScript *in_RDI;
  anon_class_40_2_0b0a90de_for_m_f *in_stack_fffffffffffffbb8;
  ChaiScript *in_stack_fffffffffffffbc0;
  string *t_name;
  Type_Info *in_stack_fffffffffffffbc8;
  ChaiScript *in_stack_fffffffffffffbd0;
  ChaiScript *this;
  offset_in_BaseCoroutine_to_subr in_stack_fffffffffffffbe0;
  undefined1 local_361 [33];
  undefined8 local_340;
  string local_338 [55];
  allocator local_301;
  string local_300 [63];
  allocator local_2c1;
  string local_2c0 [79];
  allocator local_271;
  string local_270 [32];
  undefined8 local_250;
  string local_248 [55];
  allocator local_211;
  string local_210 [63];
  allocator local_1d1;
  string local_1d0 [79];
  allocator local_181;
  string local_180 [32];
  code *local_160;
  undefined8 local_158;
  allocator local_139;
  string local_138 [32];
  code *local_118;
  undefined8 local_110;
  allocator local_f1;
  string local_f0 [32];
  code *local_d0;
  undefined8 local_c8;
  allocator local_a9;
  string local_a8 [32];
  code *local_88;
  undefined8 local_80;
  allocator local_51;
  string local_50 [64];
  undefined8 local_10;
  ChaiScript *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  chaiscript::user_type<henson::BaseCoroutine>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"BaseCoroutine",&local_51);
  chaiscript::ChaiScript::add<chaiscript::Type_Info>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,(string *)in_stack_fffffffffffffbc0
            );
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_88 = henson::BaseCoroutine::running;
  local_80 = 0;
  chaiscript::fun<bool,henson::BaseCoroutine>(in_stack_fffffffffffffbe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"running",&local_a9);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffbd0,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffbc8,
             (string *)in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x2983e1);
  local_d0 = henson::BaseCoroutine::signal_stop;
  local_c8 = 0;
  chaiscript::fun<void,henson::BaseCoroutine>(in_stack_fffffffffffffbe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"signal_stop",&local_f1);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffbd0,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffbc8,
             (string *)in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x2984a2);
  local_118 = henson::BaseCoroutine::total_time;
  local_110 = 0;
  chaiscript::fun<unsigned_long_long,henson::BaseCoroutine>(in_stack_fffffffffffffbe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"total_time",&local_139);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffbd0,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffbc8,
             (string *)in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x298563);
  local_160 = henson::BaseCoroutine::name_abi_cxx11_;
  local_158 = 0;
  chaiscript::fun<std::__cxx11::string_const&,henson::BaseCoroutine>(in_stack_fffffffffffffbe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"name",&local_181);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffbd0,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffbc8,
             (string *)in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x298624);
  chaiscript::base_class<henson::BaseCoroutine,henson::Puppet>(in_stack_fffffffffffffbb8);
  chaiscript::ChaiScript::add
            (in_stack_fffffffffffffbc0,(Type_Conversion *)in_stack_fffffffffffffbb8);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr
            ((shared_ptr<chaiscript::detail::Type_Conversion_Base> *)0x29866b);
  chaiscript::user_type<henson::Puppet>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"Puppet",&local_1d1);
  chaiscript::ChaiScript::add<chaiscript::Type_Info>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,(string *)in_stack_fffffffffffffbc0
            );
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  chaiscript::fun<chai_puppet(chaiscript::ChaiScript&,henson::NameMap&,std::__cxx11::string)::__0>
            ((anon_class_1_0_00000001_for_m_f *)in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"proceed",&local_211);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffbd0,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffbc8,
             (string *)in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x29877a);
  local_250 = local_10;
  std::__cxx11::string::string(local_248,in_RDX);
  chaiscript::fun<chai_puppet(chaiscript::ChaiScript&,henson::NameMap&,std::__cxx11::string)::__1>
            ((anon_class_40_2_0b0a90de_for_m_f *)in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"load",&local_271);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffbd0,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffbc8,
             (string *)in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x298833);
  chai_puppet(chaiscript::ChaiScript&,henson::NameMap&,std::__cxx11::string)::$_1::~__1
            ((anon_class_40_2_0b0a90de_for_m_f *)0x298840);
  chaiscript::base_class<henson::BaseCoroutine,henson::PythonPuppet>(in_stack_fffffffffffffbb8);
  chaiscript::ChaiScript::add
            (in_stack_fffffffffffffbc0,(Type_Conversion *)in_stack_fffffffffffffbb8);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr
            ((shared_ptr<chaiscript::detail::Type_Conversion_Base> *)0x298881);
  chaiscript::user_type<henson::PythonPuppet>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"PythonPuppet",&local_2c1);
  chaiscript::ChaiScript::add<chaiscript::Type_Info>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,(string *)in_stack_fffffffffffffbc0
            );
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  this = local_8;
  chaiscript::fun<chai_puppet(chaiscript::ChaiScript&,henson::NameMap&,std::__cxx11::string)::__2>
            ((anon_class_1_0_00000001_for_m_f *)in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"proceed",&local_301);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (this,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffbc8
             ,(string *)in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x298990);
  local_340 = local_10;
  std::__cxx11::string::string(local_338,in_RDX);
  chaiscript::fun<chai_puppet(chaiscript::ChaiScript&,henson::NameMap&,std::__cxx11::string)::__3>
            (in_stack_fffffffffffffbb8);
  t_name = (string *)local_361;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_361 + 1),"python",(allocator *)t_name);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (this,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_8,t_name);
  std::__cxx11::string::~string((string *)(local_361 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_361);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x298a49);
  chai_puppet(chaiscript::ChaiScript&,henson::NameMap&,std::__cxx11::string)::$_3::~__3
            ((anon_class_40_2_0b0a90de_for_m_f *)0x298a56);
  return;
}

Assistant:

void chai_puppet(chaiscript::ChaiScript& chai, henson::NameMap& namemap, std::string script_prefix)
{
    // BaseCoroutine
    chai.add(chaiscript::user_type<h::BaseCoroutine>(), "BaseCoroutine");
    chai.add(chaiscript::fun(&h::BaseCoroutine::running),      "running");
    chai.add(chaiscript::fun(&h::BaseCoroutine::signal_stop),  "signal_stop");
    chai.add(chaiscript::fun(&h::BaseCoroutine::total_time),   "total_time");
    chai.add(chaiscript::fun(&h::BaseCoroutine::name),         "name");

    // Puppet
    chai.add(chaiscript::base_class<h::BaseCoroutine, h::Puppet>());
    chai.add(chaiscript::user_type<h::Puppet>(),        "Puppet");
    chai.add(chaiscript::fun([](h::Puppet& puppet)
    {
        active_puppet = puppet.name();
        logger->debug("Proceeding with {}", puppet.name());
        puppet.proceed();
        return puppet.running();
    }), "proceed");

    chai.add(chaiscript::fun([&namemap,script_prefix](std::string cmd_line_str, henson::ProcMap* pm)
    {
        auto cmd_line = h::CommandLine(cmd_line_str);
        return std::make_shared<h::Puppet>(cmd_line.executable(script_prefix),
                                           cmd_line.argv.size(),
                                           &cmd_line.argv[0],
                                           pm,
                                           &namemap);
    }), "load");

#ifdef HENSON_PYTHON
    // PythonPuppet
    chai.add(chaiscript::base_class<h::BaseCoroutine, h::PythonPuppet>());
    chai.add(chaiscript::user_type<h::PythonPuppet>(),  "PythonPuppet");
    chai.add(chaiscript::fun([](h::PythonPuppet& puppet)
    {
        active_puppet = puppet.name();
        logger->debug("Proceeding with {}", puppet.name());
        puppet.proceed();
        return puppet.running();
    }), "proceed");
    chai.add(chaiscript::fun([&namemap,script_prefix](std::string python_cmd_line_str, henson::ProcMap* pm)
    {
        auto cmd_line = h::CommandLine(python_cmd_line_str);
        return std::make_shared<h::PythonPuppet>(cmd_line.executable(script_prefix), cmd_line.argv, pm, &namemap);
    }), "python");
#endif
}